

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
llvm::Expected<llvm::DWARFDebugNames::Entry>::moveConstruct<llvm::DWARFDebugNames::Entry>
          (Expected<llvm::DWARFDebugNames::Entry> *this,
          Expected<llvm::DWARFDebugNames::Entry> *Other)

{
  byte bVar1;
  error_type *peVar2;
  error_type *peVar3;
  storage_type *this_00;
  storage_type *psVar4;
  
  bVar1 = Other->field_0xb8 & 1;
  this->field_0xb8 = this->field_0xb8 & 0xfe | bVar1;
  if (bVar1 != 0) {
    peVar2 = getErrorStorage(this);
    peVar3 = getErrorStorage(Other);
    (peVar2->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         (peVar3->_M_t).
         super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
         super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
         super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
    (peVar3->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x0;
    return;
  }
  this_00 = getStorage(this);
  psVar4 = getStorage(Other);
  DWARFDebugNames::Entry::Entry(this_00,psVar4);
  return;
}

Assistant:

void moveConstruct(Expected<OtherT> &&Other) {
    HasError = Other.HasError;
#if LLVM_ENABLE_ABI_BREAKING_CHECKS
    Unchecked = true;
    Other.Unchecked = false;
#endif

    if (!HasError)
      new (getStorage()) storage_type(std::move(*Other.getStorage()));
    else
      new (getErrorStorage()) error_type(std::move(*Other.getErrorStorage()));
  }